

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_two_connects.c
# Opt level: O2

void client_socket_close_hook(cio_socket *socket)

{
  cio_error cVar1;
  cio_address_family address_family;
  char *pcVar2;
  size_t sStack_90;
  cio_inet_address inet_address;
  cio_socket_address client_endpoint;
  
  cVar1 = cio_init_inet_address(&inet_address,"\x7f",4);
  if (cVar1 == CIO_SUCCESS) {
    cVar1 = cio_init_inet_socket_address(&client_endpoint,&inet_address,0x3039);
    if (cVar1 == CIO_SUCCESS) {
      address_family = cio_socket_address_get_family(&client_endpoint);
      cVar1 = cio_socket_init(&second_client_socket,address_family,&loop,1000000000,
                              second_client_socket_close_hook);
      if (cVar1 == CIO_SUCCESS) {
        cVar1 = cio_socket_set_tcp_fast_open(&second_client_socket,true);
        if (cVar1 == CIO_SUCCESS) {
          cVar1 = cio_socket_connect(&second_client_socket,&client_endpoint,handle_connect,
                                     &second_client);
          if (cVar1 == CIO_SUCCESS) {
            return;
          }
          pcVar2 = "second client could not connect to server!\n";
          sStack_90 = 0x2b;
        }
        else {
          pcVar2 = "could not enable TCP FASTOPEN for active (connect) socket!\n";
          sStack_90 = 0x3b;
        }
        fwrite(pcVar2,sStack_90,1,_stderr);
        cio_socket_close(&second_client_socket);
        goto LAB_00101863;
      }
      pcVar2 = "could not init client socket endpoint!\n";
      sStack_90 = 0x27;
    }
    else {
      pcVar2 = "could not init second client socket endpoint!\n";
      sStack_90 = 0x2e;
    }
  }
  else {
    pcVar2 = "could not init second client socket inet address!\n";
    sStack_90 = 0x32;
  }
  fwrite(pcVar2,sStack_90,1,_stderr);
LAB_00101863:
  cio_eventloop_cancel(&loop);
  return;
}

Assistant:

static void client_socket_close_hook(struct cio_socket *socket)
{
	(void)socket;

	static const uint8_t IP[4] = {127, 0, 0, 1};
	struct cio_inet_address inet_address;
	enum cio_error err = cio_init_inet_address(&inet_address, IP, sizeof(IP));
	if (cio_unlikely(err != CIO_SUCCESS)) {
		(void)fprintf(stderr, "could not init second client socket inet address!\n");
		goto err;
	}

	struct cio_socket_address client_endpoint;
	err = cio_init_inet_socket_address(&client_endpoint, &inet_address, SERVERSOCKET_LISTEN_PORT);
	if (cio_unlikely(err != CIO_SUCCESS)) {
		(void)fprintf(stderr, "could not init second client socket endpoint!\n");
		goto err;
	}

	err = cio_socket_init(&second_client_socket, cio_socket_address_get_family(&client_endpoint), &loop, CLOSE_TIMEOUT_NS, second_client_socket_close_hook);
	if (cio_unlikely(err != CIO_SUCCESS)) {
		(void)fprintf(stderr, "could not init client socket endpoint!\n");
		goto err;
	}

	err = cio_socket_set_tcp_fast_open(&second_client_socket, true);
	if (cio_unlikely(err != CIO_SUCCESS)) {
		(void)fprintf(stderr, "could not enable TCP FASTOPEN for active (connect) socket!\n");
		goto client_socket_close;
	}

	err = cio_socket_connect(&second_client_socket, &client_endpoint, handle_connect, &second_client);
	if (err != CIO_SUCCESS) {
		(void)fprintf(stderr, "second client could not connect to server!\n");
		goto client_socket_close;
	}

	return;

client_socket_close:
	cio_socket_close(&second_client_socket);
err:
	cio_eventloop_cancel(&loop);
}